

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CNegativeNoVAOElements<glcts::(anonymous_namespace)::test_api::ES3>::Cleanup
          (CNegativeNoVAOElements<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CNegativeNoVAOElements<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  glu::CallLogWrapper::glUseProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_ebo);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_bufferIndirect);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(_program);
		glDeleteBuffers(1, &_buffer);
		glDeleteBuffers(1, &_ebo);
		glDeleteBuffers(1, &_bufferIndirect);
		return NO_ERROR;
	}